

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.h
# Opt level: O1

void __thiscall TTD::FileReader::ReadBytesInto_Fixed<unsigned_char>(FileReader *this,uchar *data)

{
  byte *src;
  size_t sizeInBytes;
  
  sizeInBytes = this->m_buffCount - this->m_cursor;
  if (sizeInBytes == 0) {
    ReadBlock(this,this->m_buffer,&this->m_buffCount);
    this->m_cursor = 0;
    sizeInBytes = this->m_buffCount;
    if (sizeInBytes == 0) {
      TTDAbort_unrecoverable_error("Not sure what happened");
    }
    src = this->m_buffer;
  }
  else {
    src = this->m_buffer + this->m_cursor;
  }
  js_memcpy_s(data,sizeInBytes,src,1);
  this->m_cursor = this->m_cursor + 1;
  return;
}

Assistant:

void ReadBytesInto_Fixed(T& data)
        {
            size_t sizeAvailable = (this->m_buffCount - this->m_cursor);
            byte* buff = (byte*)&data;

            if(sizeAvailable >= sizeof(T))
            {
                js_memcpy_s(buff, sizeAvailable, this->m_buffer + this->m_cursor, sizeof(T));
                this->m_cursor += sizeof(T);
            }
            else
            {
                if(sizeAvailable > 0)
                {
                    js_memcpy_s(buff, sizeAvailable, this->m_buffer + this->m_cursor, sizeAvailable);
                    this->m_cursor += sizeAvailable;
                }

                byte* remainingBuff = (buff + sizeAvailable);
                size_t remainingBytes = (sizeof(T) - sizeAvailable);

                if(remainingBytes > 0)
                {
                    this->ReadBlock(this->m_buffer, &this->m_buffCount);
                    this->m_cursor = 0;

                    TTDAssert(this->m_buffCount >= remainingBytes, "Not sure what happened");
                    js_memcpy_s(remainingBuff, this->m_buffCount, this->m_buffer, remainingBytes);
                    this->m_cursor += remainingBytes;
                }
            }
        }